

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

Size __thiscall asl::Console::size(Console *this)

{
  Size SVar1;
  int iVar2;
  ushort local_20;
  ushort local_1e;
  WinSize win;
  Console *this_local;
  Size s;
  
  win = (WinSize)this;
  memset(&this_local,0,8);
  iVar2 = ioctl(0,0x5413,&local_20);
  if (iVar2 == 0) {
    this_local._4_4_ = (uint)local_20;
    this_local._0_4_ = (uint)local_1e;
  }
  SVar1.h = this_local._4_4_;
  SVar1.w = (uint)this_local;
  return SVar1;
}

Assistant:

Console::Size Console::size()
{
	struct WinSize
	{
		unsigned short ws_row;
		unsigned short ws_col;
		unsigned short ws_xpixel;
		unsigned short ws_ypixel;
	};
	WinSize win;
	
	Console::Size s = {0, 0};

	if (ioctl(0, TIOCGWINSZ, &win) == 0)
	{
		s.h = win.ws_row;
		s.w = win.ws_col;
	}
	return s;
}